

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void luaD_throw(lua_State *L,int errcode)

{
  global_State *pgVar1;
  StkId pTVar2;
  StkId pTVar3;
  int iVar4;
  TValue *io2;
  TValue *io1;
  global_State *g;
  int errcode_local;
  lua_State *L_local;
  
  if (L->errorJmp != (lua_longjmp *)0x0) {
    L->errorJmp->status = errcode;
    _longjmp((__jmp_buf_tag *)L->errorJmp->b,1);
  }
  pgVar1 = L->l_G;
  iVar4 = luaF_close(L,L->stack,errcode);
  L->status = (lu_byte)iVar4;
  if (pgVar1->mainthread->errorJmp == (lua_longjmp *)0x0) {
    if (pgVar1->panic != (lua_CFunction)0x0) {
      luaD_seterrorobj(L,iVar4,L->top);
      if (L->ci->top < L->top) {
        L->ci->top = L->top;
      }
      iVar4 = **(int **)&L[-1].hookmask + -1;
      **(int **)&L[-1].hookmask = iVar4;
      if (iVar4 != 0) {
        __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x8e,"void luaD_throw(lua_State *, int)");
      }
      (*pgVar1->panic)(L);
    }
    abort();
  }
  pTVar2 = pgVar1->mainthread->top;
  pgVar1->mainthread->top = pTVar2 + 1;
  pTVar3 = L->top;
  pTVar2->value_ = pTVar3[-1].value_;
  pTVar2->tt_ = pTVar3[-1].tt_;
  if ((pTVar2->tt_ & 0x8000) != 0) {
    if ((pTVar2->tt_ & 0x8000) == 0) {
      __assert_fail("(((io1)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x86,"void luaD_throw(lua_State *, int)");
    }
    if ((pTVar2->tt_ & 0x7f) != (ushort)((pTVar2->value_).gc)->tt) {
LAB_0013ab38:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x86,"void luaD_throw(lua_State *, int)");
    }
    if (L != (lua_State *)0x0) {
      if ((pTVar2->tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x86,"void luaD_throw(lua_State *, int)");
      }
      if ((((pTVar2->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_0013ab38;
    }
  }
  luaD_throw(pgVar1->mainthread,iVar4);
}

Assistant:

l_noret luaD_throw (lua_State *L, int errcode) {
  if (L->errorJmp) {  /* thread has an error handler? */
    L->errorJmp->status = errcode;  /* set status */
    LUAI_THROW(L, L->errorJmp);  /* jump to it */
  }
  else {  /* thread has no error handler */
    global_State *g = G(L);
#ifdef RAVI_DEFER_STATEMENT
    errcode = luaF_close(L, L->stack, errcode);  /* close all upvalues */
#endif
    L->status = cast_byte(errcode);  /* mark it as dead */
    if (g->mainthread->errorJmp) {  /* main thread has a handler? */
      setobjs2s(L, g->mainthread->top++, L->top - 1);  /* copy error obj. */
      luaD_throw(g->mainthread, errcode);  /* re-throw in main thread */
    }
    else {  /* no handler at all; abort */
      if (g->panic) {  /* panic function? */
        luaD_seterrorobj(L, errcode, L->top);  /* assume EXTRA_STACK */
        if (L->ci->top < L->top)
          L->ci->top = L->top;  /* pushing msg. can break this invariant */
        lua_unlock(L);
        g->panic(L);  /* call panic function (last chance to jump out) */
      }
      abort();
    }
  }
}